

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O0

ByteArray * __thiscall BamTools::Internal::ByteArray::Remove(ByteArray *this,size_t from,size_t n)

{
  size_type sVar1;
  reference __dest;
  reference __src;
  long in_RDX;
  ulong in_RSI;
  ByteArray *in_RDI;
  size_t originalSize;
  size_t in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&in_RDI->m_data);
  local_8 = in_RDI;
  if (in_RSI < sVar1) {
    if (in_RSI + in_RDX < sVar1) {
      __dest = std::vector<char,_std::allocator<char>_>::operator[](&in_RDI->m_data,in_RSI);
      __src = std::vector<char,_std::allocator<char>_>::operator[](&in_RDI->m_data,in_RSI + in_RDX);
      memmove(__dest,__src,(sVar1 - in_RSI) - in_RDX);
      Resize(in_RDI,(size_t)__dest);
      local_8 = in_RDI;
    }
    else {
      Resize(in_RDI,in_stack_ffffffffffffffc8);
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

ByteArray& ByteArray::Remove(std::size_t from, std::size_t n)
{

    // if 'from' outside range, just return
    const std::size_t originalSize = m_data.size();
    if (from >= originalSize) {
        return *this;
    }

    // if asked to clip from 'from' to end (or beyond), simply resize
    if (from + n >= originalSize) {
        Resize(from);

        // otherwise, shift data & resize
    } else {
        std::memmove(&m_data[from], &m_data[from + n], (originalSize - from - n));
        Resize(originalSize - n);
    }

    // return reference to modified byte array
    return *this;
}